

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxRuntimeStateIndex::Emit(FxRuntimeStateIndex *this,VMFunctionBuilder *build)

{
  uint uVar1;
  ExpEmit EVar2;
  VMFunctionBuilder *build_local;
  FxRuntimeStateIndex *this_local;
  ExpEmit out;
  undefined4 extraout_var;
  
  EVar2._0_4_ = (*this->Index->_vptr_FxExpression[9])();
  EVar2.Konst = (bool)(char)extraout_var;
  EVar2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  uVar1 = VMFunctionBuilder::GetConstantInt(build,0);
  VMFunctionBuilder::Emit(build,0x80,EVar2._0_4_ & 0xffff,EVar2._0_4_ & 0xffff,uVar1);
  uVar1 = VMFunctionBuilder::GetConstantInt(build,0x7fff);
  VMFunctionBuilder::Emit(build,0x7e,EVar2._0_4_ & 0xffff,EVar2._0_4_ & 0xffff,uVar1);
  VMFunctionBuilder::Emit(build,0x5b,EVar2._0_4_ & 0xffff,EVar2._0_4_ & 0xffff,0x10);
  uVar1 = VMFunctionBuilder::GetConstantInt(build,this->symlabel | 0x80000000);
  VMFunctionBuilder::Emit(build,0x7a,EVar2._0_4_ & 0xffff,EVar2._0_4_ & 0xffff,uVar1);
  return EVar2;
}

Assistant:

ExpEmit FxRuntimeStateIndex::Emit(VMFunctionBuilder *build)
{
	ExpEmit out = Index->Emit(build);
	// out = (clamp(Index, 0, 32767) << 16) | symlabel | 0x80000000;  0x80000000 is here to make it negative.
	build->Emit(OP_MAX_RK, out.RegNum, out.RegNum, build->GetConstantInt(0));
	build->Emit(OP_MIN_RK, out.RegNum, out.RegNum, build->GetConstantInt(32767));
	build->Emit(OP_SLL_RI, out.RegNum, out.RegNum, 16);
	build->Emit(OP_OR_RK, out.RegNum, out.RegNum, build->GetConstantInt(symlabel|0x80000000));
	return out;
}